

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

int ON_ParseSettings::Compare(ON_ParseSettings *a,ON_ParseSettings *b)

{
  ulong local_28;
  size_t i;
  ON_ParseSettings *b_local;
  ON_ParseSettings *a_local;
  
  if ((a == (ON_ParseSettings *)0x0) || (b == (ON_ParseSettings *)0x0)) {
    if (b == (ON_ParseSettings *)0x0) {
      if (a == (ON_ParseSettings *)0x0) {
        a_local._4_4_ = 0;
      }
      else {
        a_local._4_4_ = 1;
      }
    }
    else {
      a_local._4_4_ = -1;
    }
  }
  else {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      if (a->m_true_default_bits[local_28] < b->m_true_default_bits[local_28]) {
        return -1;
      }
      if (b->m_true_default_bits[local_28] < a->m_true_default_bits[local_28]) {
        return 1;
      }
    }
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      if (a->m_false_default_bits[local_28] < b->m_false_default_bits[local_28]) {
        return -1;
      }
      if (b->m_false_default_bits[local_28] < a->m_false_default_bits[local_28]) {
        return 1;
      }
    }
    if (a->m_context_locale_id < b->m_context_locale_id) {
      a_local._4_4_ = -1;
    }
    else if (b->m_context_locale_id < a->m_context_locale_id) {
      a_local._4_4_ = 1;
    }
    else if (a->m_context_length_unit_system < b->m_context_length_unit_system) {
      a_local._4_4_ = -1;
    }
    else if (b->m_context_length_unit_system < a->m_context_length_unit_system) {
      a_local._4_4_ = 1;
    }
    else if (a->m_context_angle_unit_system < b->m_context_angle_unit_system) {
      a_local._4_4_ = -1;
    }
    else if (b->m_context_angle_unit_system < a->m_context_angle_unit_system) {
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

const int ON_ParseSettings::Compare(
  const ON_ParseSettings* a,
  const ON_ParseSettings* b
  )
{
  size_t i;

  if ( 0 == a || 0 == b )
  {
    if ( 0 != b )
      return -1;
    if ( 0 != a )
      return 1;
    return 0;
  }
  
  for ( i = 0; i < sizeof(a->m_true_default_bits)/sizeof(a->m_true_default_bits[0]); i++ )
  {
    if ( a->m_true_default_bits[i] < b->m_true_default_bits[i] )
      return -1;
    if ( b->m_true_default_bits[i] < a->m_true_default_bits[i] )
      return 1;
  }
  
  for ( i = 0; i < sizeof(a->m_false_default_bits)/sizeof(a->m_false_default_bits[0]); i++ )
  {
    if ( a->m_false_default_bits[i] < b->m_false_default_bits[i] )
      return -1;
    if ( b->m_false_default_bits[i] < a->m_false_default_bits[i] )
      return 1;
  }

  if ( a->m_context_locale_id < b->m_context_locale_id )
    return -1;
  if ( b->m_context_locale_id < a->m_context_locale_id )
    return 1;

  if ( a->m_context_length_unit_system < b->m_context_length_unit_system )
    return -1;
  if ( b->m_context_length_unit_system < a->m_context_length_unit_system )
    return 1;

  if ( a->m_context_angle_unit_system < b->m_context_angle_unit_system )
    return -1;
  if ( b->m_context_angle_unit_system < a->m_context_angle_unit_system )
    return 1;

  return 0;
}